

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O1

void Cba_ObjSetFunc(Cba_Ntk_t *p,int i,int x)

{
  int Fill;
  char *__assertion;
  
  if (i < 1) {
    __assertion = "i>0";
  }
  else {
    if (0 < (p->vObjFunc).nSize) {
      Vec_IntFillExtra(&p->vObjFunc,i + 1,x);
      if ((p->vObjFunc).nSize <= i) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((p->vObjFunc).pArray[(uint)i] == 0) {
        Vec_IntFillExtra(&p->vObjFunc,i + 1,Fill);
        if (i < (p->vObjFunc).nSize) {
          (p->vObjFunc).pArray[(uint)i] = x;
          return;
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __assert_fail("Cba_ObjFunc(p, i) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                    ,0xf8,"void Cba_ObjSetFunc(Cba_Ntk_t *, int, int)");
    }
    __assertion = "Cba_NtkHasObjFuncs(p)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                ,0xef,"int Cba_ObjFunc(Cba_Ntk_t *, int)");
}

Assistant:

static inline int            Cba_ObjFunc( Cba_Ntk_t * p, int i )             { assert(i>0); assert( Cba_NtkHasObjFuncs(p) );  return Vec_IntGetEntry(&p->vObjFunc, i);     }